

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O0

void __thiscall
lddgraph::ldd(lddgraph *this,string *file,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *libraries)

{
  undefined8 this_00;
  bool bVar1;
  istream *piVar2;
  long lVar3;
  string *__x;
  string local_2d8 [32];
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290;
  string local_270;
  undefined1 local_250 [8];
  string lddline;
  istringstream cmdstream;
  string local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [32];
  string local_40 [8];
  string cmdresult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *libraries_local;
  string *file_local;
  lddgraph *this_local;
  
  cmdresult.field_2._8_8_ = libraries;
  std::__cxx11::string::string(local_40);
  if ((this->_useldd & 1U) == 0) {
    setenv("LD_TRACE_LOADED_OBJECTS","1",1);
    system((char *)local_b0);
    std::__cxx11::string::operator=(local_40,local_b0);
    std::__cxx11::string::~string(local_b0);
    unsetenv("LD_TRACE_LOADED_OBJECTS");
  }
  else {
    std::operator+(&local_80,"ldd ",file);
    system((char *)local_60);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((this->_verbose & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,local_40);
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)((long)&lddline.field_2 + 8),local_40,8);
  std::__cxx11::string::string((string *)local_250);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(lddline.field_2._M_local_buf + 8),(string *)local_250,'\n');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_270,(string *)local_250);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"=>",&local_291);
    bVar1 = contains(&local_270,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_270);
    if (bVar1) {
      std::__cxx11::string::find_first_of((char)local_250,0x3e);
      std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_250);
      std::__cxx11::string::operator=((string *)local_250,local_2b8);
      std::__cxx11::string::~string(local_2b8);
    }
    std::__cxx11::string::find_first_of((char)local_250,0x28);
    std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_250);
    std::__cxx11::string::operator=((string *)local_250,local_2d8);
    std::__cxx11::string::~string(local_2d8);
    trim((string *)local_250);
    lVar3 = std::__cxx11::string::size();
    if ((lVar3 != 0) &&
       (bVar1 = std::operator!=(file,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_250), this_00 = cmdresult.field_2._8_8_, bVar1)) {
      __x = trim((string *)local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,__x);
    }
  }
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::istringstream::~istringstream((istringstream *)(lddline.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ldd(const string & file, vector<string> & libraries)
    {
      string cmdresult;
      if (_useldd)
      {
        cmdresult = system("ldd " + file);
      }
      else
      {
        setenv("LD_TRACE_LOADED_OBJECTS", "1", 1);
        cmdresult = system(file);
        unsetenv("LD_TRACE_LOADED_OBJECTS");
      }
      if (_verbose)
        cout << cmdresult;
      istringstream cmdstream(cmdresult);
      string lddline;
      while (std::getline(cmdstream, lddline, '\n'))
      {
        if (contains(lddline, "=>"))
          lddline = lddline.substr(lddline.find_first_of('>') + 1);
        lddline = lddline.substr(0, lddline.find_first_of('('));
        trim(lddline);
        if (lddline.size() > 0 && file != lddline)
          libraries.push_back(trim(lddline));
      }
    }